

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void update(float dt)

{
  float *pfVar1;
  float fVar2;
  undefined8 uVar3;
  cgltf_animation *pcVar4;
  cgltf_accessor *pcVar5;
  ulong uVar6;
  cgltf_size cVar7;
  cgltf_animation_channel *pcVar8;
  cgltf_animation_sampler *sampler;
  ulong uVar9;
  void *pvVar10;
  cgltf_accessor *pcVar11;
  cgltf_size cVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  long lVar17;
  i32 numKeys;
  long lVar18;
  char *__function;
  ulong uVar19;
  ulong uVar20;
  cgltf_node *node;
  cgltf_node *node_00;
  long lVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  undefined8 *puVar26;
  float fVar27;
  undefined4 uVar28;
  float fVar29;
  undefined4 uVar30;
  float fVar31;
  undefined8 uVar32;
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  vec<3,_float,_(glm::qualifier)0> vVar39;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_70;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined4 local_34;
  
  uVar9 = DAT_003e8970;
  if (parsedData != (cgltf_data *)0x0) {
    lVar18 = (long)anims::playingInd;
    if (0 < lVar18) {
      pcVar4 = parsedData->animations;
      fVar27 = fmodf(dt + anims::time,anims::duration);
      uVar20 = DAT_003e8970;
      lVar25 = anims::curKeyInds;
      anims::time = fVar27;
      if ((fVar27 < 0.0) || (anims::duration <= fVar27)) {
        __assert_fail("time >= 0 && time < duration",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                      ,0x1eb,"void anims::update(float)");
      }
      if (0 < (int)(uint)uVar9) {
        uVar19 = 0;
LAB_00112d1c:
        if (uVar19 != uVar20) {
          pcVar5 = pcVar4[lVar18 + -1].samplers[uVar19].input;
          uVar6 = pcVar5->count;
          iVar22 = *(int *)(lVar25 + uVar19 * 4);
          do {
            if (iVar22 == -1) {
              if (uVar6 == 0) goto LAB_00113286;
              fVar2 = *(float *)((long)pcVar5->buffer_view->buffer->data +
                                pcVar5->offset + pcVar5->buffer_view->offset);
              iVar22 = 0;
joined_r0x00112da8:
              if (fVar27 < fVar2) goto LAB_00112e0e;
            }
            else {
              uVar24 = (ulong)iVar22;
              if (iVar22 == (int)uVar6 + -1) {
                if (uVar6 <= uVar24) goto LAB_00113286;
                iVar22 = -1;
                if (*(float *)((long)pcVar5->buffer_view->buffer->data +
                              uVar24 * pcVar5->stride + pcVar5->offset + pcVar5->buffer_view->offset
                              ) <= fVar27) goto LAB_00112e0e;
              }
              else {
                if (uVar6 <= uVar24) goto LAB_00113286;
                iVar23 = iVar22 + 1;
                if (uVar6 <= (ulong)(long)iVar23) goto LAB_00113286;
                pvVar10 = pcVar5->buffer_view->buffer->data;
                lVar17 = pcVar5->offset + pcVar5->buffer_view->offset;
                iVar22 = -1;
                if (*(float *)((long)pvVar10 + uVar24 * pcVar5->stride + lVar17) <= fVar27) {
                  fVar2 = *(float *)((long)pvVar10 + pcVar5->stride * (long)iVar23 + lVar17);
                  iVar22 = iVar23;
                  goto joined_r0x00112da8;
                }
              }
            }
            *(int *)(lVar25 + uVar19 * 4) = iVar22;
          } while( true );
        }
        goto LAB_001132a5;
      }
LAB_00112e1a:
      cVar7 = pcVar4[lVar18 + -1].channels_count;
      if (cVar7 != 0) {
        pcVar8 = pcVar4[lVar18 + -1].channels;
        lVar25 = 0;
        do {
          sampler = *(cgltf_animation_sampler **)((long)&pcVar8->sampler + lVar25);
          lVar17 = (long)sampler - (long)pcVar4[lVar18 + -1].samplers >> 3;
          if (DAT_003e8970 <= (ulong)(lVar17 * -0x3333333333333333)) {
LAB_001132a5:
            __function = "T &tl::Vector<int>::operator[](size_t) [T = int]";
LAB_001132d1:
            __assert_fail("i < _size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/containers/vector.hpp"
                          ,0x2c,__function);
          }
          lVar21 = *(long *)((long)&pcVar8->target_node + lVar25) - (long)parsedData->nodes >> 3;
          uVar19 = lVar21 * -0x7b425ed097b425ed;
          iVar22 = *(int *)(anims::curKeyInds + lVar17 * 0x3333333333333334);
          uVar20 = (ulong)iVar22;
          pcVar5 = sampler->input;
          uVar9 = pcVar5->count;
          iVar23 = *(int *)((long)&pcVar8->target_path + lVar25);
          numKeys = (i32)uVar9;
          if (iVar23 != 3) {
            if (iVar23 == 2) {
              if (uVar19 < DAT_003e8928) {
                puVar26 = *(undefined8 **)(anims::nodesData + 8 + lVar21 * 0x71c71c71c71c71c8);
                if (puVar26 == (undefined8 *)0x0) {
                  __assert_fail("&rot",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                                ,0x226,"void anims::update(float)");
                }
                if (sampler->interpolation == cgltf_interpolation_type_linear) {
                  if (iVar22 == -1) {
                    pcVar5 = sampler->output;
                    if (pcVar5->count == 0) goto LAB_00113286;
                    pvVar10 = pcVar5->buffer_view->buffer->data;
                    cVar12 = pcVar5->buffer_view->offset;
                    uVar32 = *(undefined8 *)((long)pvVar10 + pcVar5->offset + cVar12);
                    uVar3 = *(undefined8 *)((long)pvVar10 + pcVar5->offset + 8 + cVar12);
                    uVar28 = (undefined4)uVar3;
                    uVar30 = (undefined4)((ulong)uVar3 >> 0x20);
                  }
                  else {
                    pcVar11 = sampler->output;
                    uVar19 = pcVar11->count;
                    if (numKeys + -1 == iVar22) {
                      if (uVar19 <= uVar20) goto LAB_00113286;
                      pvVar10 = pcVar11->buffer_view->buffer->data;
                      lVar17 = pcVar11->offset + pcVar11->buffer_view->offset;
                      lVar21 = pcVar11->stride * uVar20;
                      uVar32 = *(undefined8 *)((long)pvVar10 + lVar21 + lVar17);
                      uVar3 = *(undefined8 *)((long)pvVar10 + lVar21 + 8 + lVar17);
                      uVar28 = (undefined4)uVar3;
                      uVar30 = (undefined4)((ulong)uVar3 >> 0x20);
                    }
                    else {
                      if ((((uVar19 <= uVar20) || (uVar6 = uVar20 + 1, uVar19 <= uVar6)) ||
                          (uVar9 <= uVar20)) || (uVar9 <= uVar6)) {
LAB_00113286:
                        __assert_fail("i < a.count",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/utils.hpp"
                                      ,0x54,
                                      "const void *cgltfAccessAccessor(const cgltf_accessor &, cgltf_size)"
                                     );
                      }
                      pvVar10 = pcVar11->buffer_view->buffer->data;
                      lVar17 = pcVar11->offset + pcVar11->buffer_view->offset;
                      lVar21 = pcVar11->stride * uVar6;
                      pfVar1 = (float *)((long)pvVar10 + pcVar11->stride * uVar20 + lVar17);
                      fVar27 = *pfVar1;
                      fVar2 = pfVar1[1];
                      fVar14 = pfVar1[2];
                      fVar15 = pfVar1[3];
                      uVar32 = *(undefined8 *)((long)pvVar10 + lVar21 + lVar17);
                      fVar34 = (float)uVar32;
                      fVar35 = (float)((ulong)uVar32 >> 0x20);
                      uVar32 = *(undefined8 *)((long)pvVar10 + lVar21 + lVar17 + 8);
                      fVar36 = (float)uVar32;
                      fVar37 = (float)((ulong)uVar32 >> 0x20);
                      fVar31 = fVar14 * fVar36 + fVar2 * fVar35 + fVar15 * fVar37 + fVar27 * fVar34;
                      fVar29 = -fVar31;
                      if (fVar31 < fVar29) {
                        fVar34 = -fVar34;
                        fVar35 = -fVar35;
                        fVar36 = -fVar36;
                        fVar37 = -fVar37;
                      }
                      pvVar10 = pcVar5->buffer_view->buffer->data;
                      lVar17 = pcVar5->offset + pcVar5->buffer_view->offset;
                      fVar38 = *(float *)((long)pvVar10 + uVar20 * pcVar5->stride + lVar17);
                      fVar38 = (anims::time - fVar38) /
                               (*(float *)((long)pvVar10 + uVar6 * pcVar5->stride + lVar17) - fVar38
                               );
                      if (fVar29 <= fVar31) {
                        fVar29 = fVar31;
                      }
                      fVar31 = 1.0 - fVar38;
                      if (fVar29 <= 0.9999999) {
                        fVar29 = acosf(fVar29);
                        fVar31 = sinf(fVar31 * fVar29);
                        fVar38 = sinf(fVar38 * fVar29);
                        fVar29 = sinf(fVar29);
                        auVar16._4_4_ = fVar38 * fVar35 + fVar2 * fVar31;
                        auVar16._0_4_ = fVar38 * fVar34 + fVar27 * fVar31;
                        auVar16._8_4_ = fVar38 * fVar36 + fVar14 * fVar31;
                        auVar16._12_4_ = fVar38 * fVar37 + fVar15 * fVar31;
                        auVar13._4_4_ = fVar29;
                        auVar13._0_4_ = fVar29;
                        auVar13._8_4_ = fVar29;
                        auVar13._12_4_ = fVar29;
                        auVar33 = divps(auVar16,auVar13);
                      }
                      else {
                        auVar33._0_4_ = fVar27 * fVar31 + fVar34 * fVar38;
                        auVar33._4_4_ = fVar2 * fVar31 + fVar35 * fVar38;
                        auVar33._8_4_ = fVar14 * fVar31 + fVar36 * fVar38;
                        auVar33._12_4_ = fVar15 * fVar31 + fVar37 * fVar38;
                      }
                      uVar32 = auVar33._0_8_;
                      uVar28 = auVar33._8_4_;
                      uVar30 = auVar33._12_4_;
                    }
                  }
                }
                else {
                  if (sampler->interpolation != cgltf_interpolation_type_step) {
                    __assert_fail("false && \"not implemented\"",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                                  ,0x1dc,
                                  "T anims::interpolateAnim(cgltf_interpolation_type, const cgltf_animation_sampler &, i32, i32) [T = glm::qua<float>]"
                                 );
                  }
                  if (iVar22 < 1) {
                    iVar22 = 0;
                  }
                  if (numKeys < iVar22) {
                    iVar22 = numKeys;
                  }
                  pcVar5 = sampler->output;
                  if (pcVar5->count <= (ulong)(long)iVar22) goto LAB_00113286;
                  pvVar10 = pcVar5->buffer_view->buffer->data;
                  lVar17 = pcVar5->offset + pcVar5->buffer_view->offset;
                  lVar21 = (long)iVar22 * pcVar5->stride;
                  uVar32 = *(undefined8 *)((long)pvVar10 + lVar21 + lVar17);
                  uVar3 = *(undefined8 *)((long)pvVar10 + lVar21 + 8 + lVar17);
                  uVar28 = (undefined4)uVar3;
                  uVar30 = (undefined4)((ulong)uVar3 >> 0x20);
                }
                *puVar26 = uVar32;
                puVar26[1] = CONCAT44(uVar30,uVar28);
                goto LAB_001131d4;
              }
            }
            else {
              if (iVar23 != 1) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                              ,0x231,"void anims::update(float)");
              }
              if (uVar19 < DAT_003e8928) {
                puVar26 = *(undefined8 **)(anims::nodesData + lVar21 * 0x71c71c71c71c71c8);
                if (puVar26 == (undefined8 *)0x0) {
                  __assert_fail("&pos",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                                ,0x220,"void anims::update(float)");
                }
                goto LAB_00112f8f;
              }
            }
LAB_001132bc:
            __function = "T &tl::Vector<anims::NodeData>::operator[](size_t) [T = anims::NodeData]";
            goto LAB_001132d1;
          }
          if (DAT_003e8928 <= uVar19) goto LAB_001132bc;
          puVar26 = *(undefined8 **)(anims::nodesData + 0x10 + lVar21 * 0x71c71c71c71c71c8);
          if (puVar26 == (undefined8 *)0x0) {
            __assert_fail("&scale",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                          ,0x22c,"void anims::update(float)");
          }
LAB_00112f8f:
          vVar39 = anims::interpolateAnim<glm::vec<3,float,(glm::qualifier)0>>
                             (sampler->interpolation,sampler,iVar22,numKeys);
          *puVar26 = vVar39._0_8_;
          *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(puVar26 + 1) =
               vVar39.field_2;
LAB_001131d4:
          lVar25 = lVar25 + 0x28;
        } while (cVar7 * 0x28 != lVar25);
      }
    }
    tl::Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::resize<>
              ((Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)&anims::nodesMatrices,
               parsedData->nodes_count);
    if (parsedData->nodes_count != 0) {
      node_00 = parsedData->nodes;
      lVar18 = parsedData->nodes_count * 0xd8;
      do {
        if (node_00->parent == (cgltf_node *)0x0) {
          local_70.x = 1.0;
          local_6c = 0;
          uStack_64 = 0;
          local_5c = 0x3f800000;
          local_58 = 0;
          uStack_50 = 0;
          local_48 = 0x3f800000;
          local_44 = 0;
          uStack_3c = 0;
          local_34 = 0x3f800000;
          calcNodesMatricesRecursive(node_00,(mat4 *)&local_70);
        }
        node_00 = node_00 + 1;
        lVar18 = lVar18 + -0xd8;
      } while (lVar18 != 0);
    }
  }
  return;
LAB_00112e0e:
  uVar19 = uVar19 + 1;
  if (uVar19 == ((uint)uVar9 & 0x7fffffff)) goto LAB_00112e1a;
  goto LAB_00112d1c;
}

Assistant:

void update(float dt)
{
    if(!parsedData)
        return;

    anims::update(dt);

    anims::nodesMatrices.resize(parsedData->nodes_count);
    for(const cgltf_node& node : getNodes())
        if(node.parent == nullptr)
            calcNodesMatricesRecursive(node);
}